

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# definitions.hxx
# Opt level: O1

void __thiscall
stateObservation::
IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
::readFromFile(IndexedMatrixArrayT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
               *this,char *filename,Index rows,Index cols,bool withTimeStamp)

{
  char cVar1;
  long lVar2;
  undefined3 in_register_00000081;
  undefined4 uVar3;
  long lVar4;
  bool bVar5;
  Matrix m;
  int k;
  ifstream f;
  assign_op<double,_double> local_27d;
  undefined4 local_27c;
  Matrix<double,__1,__1,_0,__1,__1> local_278;
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  local_258;
  IndexedMatrixArrayT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  *local_240;
  long local_238 [4];
  byte abStack_218 [488];
  
  uVar3 = CONCAT31(in_register_00000081,withTimeStamp);
  this->k_ = 0;
  local_240 = this;
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::clear(&this->v_);
  std::ifstream::ifstream(local_238);
  std::ifstream::open((char *)local_238,(_Ios_Openmode)filename);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    local_258.m_functor.m_other = 0.0;
    local_258.m_rows.m_value = rows;
    local_258.m_cols.m_value = cols;
    if ((cols | rows) < 0) {
      __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                    ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1>]"
                   );
    }
    local_278.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
         (double *)0x0;
    local_278.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
    local_278.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
    Eigen::internal::call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              (&local_278,&local_258,&local_27d);
    local_258.m_rows.m_value = local_258.m_rows.m_value & 0xffffffff00000000;
    bVar5 = true;
    local_27c = uVar3;
    do {
      if ((char)uVar3 != '\0') {
        std::istream::operator>>((istream *)local_238,(int *)&local_258);
      }
      if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0) {
        if (0 < rows) {
          lVar4 = 0;
          do {
            if (0 < cols) {
              lVar2 = 0;
              do {
                if ((local_278.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows <= lVar4) ||
                   (local_278.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_cols <= lVar2)) {
                  __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>, Level = 1]"
                               );
                }
                std::istream::_M_extract<double>((double *)local_238);
                lVar2 = lVar2 + 1;
              } while (cols != lVar2);
            }
            lVar4 = lVar4 + 1;
          } while (lVar4 != rows);
        }
        setValue(local_240,&local_278,(long)(int)local_258.m_rows.m_value);
        local_258.m_rows.m_value._0_4_ = (int)local_258.m_rows.m_value + 1;
        uVar3 = local_27c;
      }
      else {
        bVar5 = false;
      }
    } while (bVar5);
    free(local_278.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
        );
  }
  std::ifstream::~ifstream(local_238);
  return;
}

Assistant:

void IndexedMatrixArrayT<MatrixType, Allocator>::readFromFile(const char * filename, Index rows, Index cols, bool withTimeStamp)
{
  reset();

  std::ifstream f;

  f.open(filename);

  if (f.is_open())
  {

    Matrix m(Matrix::Zero(rows,cols));

    bool continuation=true;
    int k=0;

    while (continuation)
    {


      if (withTimeStamp)
      {
        f >> k;
      }


      if (f.fail())
        continuation=false;
      else
      {
        for (Index i = 0 ; i<rows; ++i)
        {
          for (Index j = 0 ; j<cols; ++j)
          {
            f >> m(i,j);
          }
        }

        setValue(m,k);
        ++k;
      }
    }
  }
}